

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_time_GetTime::test_method(util_time_GetTime *this)

{
  time_point tVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  check_type cVar9;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  double local_110;
  int local_104;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  double *local_c0;
  assertion_result local_b8;
  double **local_a0;
  int *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  int **local_78;
  char *local_70;
  char *local_68;
  assertion_result local_60;
  long local_48 [3];
  
  local_48[2] = *(long *)(in_FS_OFFSET + 0x28);
  SetMockTime(0x6f);
  local_48[0] = 0;
  local_48[1] = 1;
  lVar2 = 0;
  do {
    local_90._vptr_lazy_ostream = (_func_int **)(*(long *)((long)local_48 + lVar2) * 1000);
    UninterruptibleSleep((microseconds *)&local_90);
    local_d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x21a;
    file.m_begin = (iterator)&local_d0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x6f;
    local_110 = (double)GetTime();
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_a0 = &local_c0;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xe94123,(size_t)&local_70,0x21a,
               &local_90,"GetTime()",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x21b;
    file_00.m_begin = (iterator)&local_120;
    msg_00.m_end = pvVar8;
    msg_00.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
               msg_00);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x6f;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000000000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xe94123,(size_t)&local_70,0x21b,
               &local_90,"Now<NodeSeconds>().time_since_epoch().count()",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x21c;
    file_01.m_begin = (iterator)&local_140;
    msg_01.m_end = pvVar8;
    msg_01.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
               msg_01);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x6f;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000000000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xe94123,(size_t)&local_70,0x21c,
               &local_90,"TicksSinceEpoch<std::chrono::seconds>(NodeClock::now())",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_160 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x21d;
    file_02.m_begin = (iterator)&local_160;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_170,
               msg_02);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x6f;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000000000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_0138a870;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xe94123,(size_t)&local_70,0x21d,
               &local_90,"TicksSinceEpoch<SecondsDouble>(Now<NodeSeconds>())",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x21e;
    file_03.m_begin = (iterator)&local_180;
    msg_03.m_end = pvVar8;
    msg_03.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
               msg_03);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x6f;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000000000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xe94123,(size_t)&local_70,0x21e,
               &local_90,"GetTime<std::chrono::seconds>().count()",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x21f;
    file_04.m_begin = (iterator)&local_1a0;
    msg_04.m_end = pvVar8;
    msg_04.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b0,
               msg_04);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x1b198;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf4c66b,(size_t)&local_70,0x21f,
               &local_90,"GetTime<std::chrono::milliseconds>().count()",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_1c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x220;
    file_05.m_begin = (iterator)&local_1c0;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1d0,
               msg_05);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 0x1b198;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf4c66b,(size_t)&local_70,0x220,
               &local_90,"TicksSinceEpoch<std::chrono::milliseconds>(NodeClock::now())",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    local_1e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_1d8 = "";
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x221;
    file_06.m_begin = (iterator)&local_1e0;
    msg_06.m_end = pvVar8;
    msg_06.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f0,
               msg_06);
    local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
    local_100._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f0 = boost::unit_test::lazy_ostream::inst;
    local_e8 = "";
    local_104 = 111000000;
    tVar1 = NodeClock::now();
    local_110 = (double)((long)tVar1.__d.__r / 1000);
    local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(local_110 == (double)(long)local_104);
    local_60.m_message.px = (element_type *)0x0;
    local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_68 = "";
    local_98 = &local_104;
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_98;
    local_c0 = &local_110;
    local_b8.m_message.px = (element_type *)((ulong)local_b8.m_message.px & 0xffffffffffffff00);
    local_b8._0_8_ = &PTR__lazy_ostream_013892a8;
    local_b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_a0 = &local_c0;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_60,(lazy_ostream *)local_100,1,2,REQUIRE,0xf4c6dc,(size_t)&local_70,0x221,
               &local_90,"GetTime<std::chrono::microseconds>().count()",&local_b8);
    boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  SetMockTime(0);
  lVar2 = std::chrono::_V2::steady_clock::now();
  lVar3 = std::chrono::_V2::steady_clock::now();
  tVar1 = NodeClock::now();
  lVar5 = SUB168(SEXT816((long)tVar1.__d.__r) * SEXT816(0x431bde82d7b634db),8);
  tVar1 = NodeClock::now();
  lVar6 = SUB168(SEXT816((long)tVar1.__d.__r) * SEXT816(0x20c49ba5e353f7cf),8);
  local_90._vptr_lazy_ostream = (_func_int **)0x3e8;
  UninterruptibleSleep((microseconds *)&local_90);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x22b;
  file_07.m_begin = (iterator)&local_200;
  msg_07.m_end = in_R9;
  msg_07.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_210,
             msg_07);
  _cVar9 = 0x6fcce2;
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "steady_ms_0 < Now<SteadyMilliseconds>()";
  local_100._8_8_ = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_218 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_78 = (int **)local_100;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(lVar2 / 1000000 < lVar4 / 1000000);
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_90,1,0,WARN,_cVar9,(size_t)&local_220,0x22b,lVar3,lVar6,lVar5);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x22c;
  file_08.m_begin = (iterator)&local_230;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_240,
             msg_08);
  _cVar9 = 0x6fcde5;
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(lVar3 + 1000000 <= lVar2);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "steady_0 + 1ms <= std::chrono::steady_clock::now()";
  local_100._8_8_ = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_248 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_78 = (int **)local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_90,1,0,WARN,_cVar9,(size_t)&local_250,0x22c);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x22d;
  file_09.m_begin = (iterator)&local_260;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_270,
             msg_09);
  _cVar9 = 0x6fcec5;
  tVar1 = NodeClock::now();
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((lVar5 >> 0x12) - (lVar5 >> 0x3f) < (long)tVar1.__d.__r / 1000000);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "ms_0 < GetTime<std::chrono::milliseconds>()";
  local_100._8_8_ = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = (int **)local_100;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_278 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_90,1,0,WARN,_cVar9,(size_t)&local_280,0x22d);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x22e;
  file_10.m_begin = (iterator)&local_290;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2a0,
             msg_10);
  _cVar9 = 0x6fcfc6;
  tVar1 = NodeClock::now();
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((lVar6 >> 7) - (lVar6 >> 0x3f) < (long)tVar1.__d.__r / 1000);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "us_0 < GetTime<std::chrono::microseconds>()";
  local_100._8_8_ = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = (int **)local_100;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2a8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_90,1,0,WARN,_cVar9,(size_t)&local_2b0,0x22e);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48[2]) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_time_GetTime)
{
    SetMockTime(111);
    // Check that mock time does not change after a sleep
    for (const auto& num_sleep : {0ms, 1ms}) {
        UninterruptibleSleep(num_sleep);
        BOOST_CHECK_EQUAL(111, GetTime()); // Deprecated time getter
        BOOST_CHECK_EQUAL(111, Now<NodeSeconds>().time_since_epoch().count());
        BOOST_CHECK_EQUAL(111, TicksSinceEpoch<std::chrono::seconds>(NodeClock::now()));
        BOOST_CHECK_EQUAL(111, TicksSinceEpoch<SecondsDouble>(Now<NodeSeconds>()));
        BOOST_CHECK_EQUAL(111, GetTime<std::chrono::seconds>().count());
        BOOST_CHECK_EQUAL(111000, GetTime<std::chrono::milliseconds>().count());
        BOOST_CHECK_EQUAL(111000, TicksSinceEpoch<std::chrono::milliseconds>(NodeClock::now()));
        BOOST_CHECK_EQUAL(111000000, GetTime<std::chrono::microseconds>().count());
    }

    SetMockTime(0);
    // Check that steady time and system time changes after a sleep
    const auto steady_ms_0 = Now<SteadyMilliseconds>();
    const auto steady_0 = std::chrono::steady_clock::now();
    const auto ms_0 = GetTime<std::chrono::milliseconds>();
    const auto us_0 = GetTime<std::chrono::microseconds>();
    UninterruptibleSleep(1ms);
    BOOST_CHECK(steady_ms_0 < Now<SteadyMilliseconds>());
    BOOST_CHECK(steady_0 + 1ms <= std::chrono::steady_clock::now());
    BOOST_CHECK(ms_0 < GetTime<std::chrono::milliseconds>());
    BOOST_CHECK(us_0 < GetTime<std::chrono::microseconds>());
}